

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

xmlNodePtr xmlNewComment(xmlChar *content)

{
  xmlChar *pxVar1;
  xmlRegisterNodeFunc *pp_Var2;
  xmlNodePtr cur;
  xmlChar *content_local;
  
  content_local = (xmlChar *)(*xmlMalloc)(0x78);
  if ((xmlNodePtr)content_local == (xmlNodePtr)0x0) {
    xmlTreeErrMemory("building comment");
    content_local = (xmlChar *)0x0;
  }
  else {
    memset(content_local,0,0x78);
    ((xmlNodePtr)content_local)->type = XML_COMMENT_NODE;
    ((xmlNodePtr)content_local)->name = "comment";
    if (content != (xmlChar *)0x0) {
      pxVar1 = xmlStrdup(content);
      ((xmlNodePtr)content_local)->content = pxVar1;
    }
    if ((__xmlRegisterCallbacks != 0) &&
       (pp_Var2 = __xmlRegisterNodeDefaultValue(), *pp_Var2 != (xmlRegisterNodeFunc)0x0)) {
      pp_Var2 = __xmlRegisterNodeDefaultValue();
      (**pp_Var2)((xmlNodePtr)content_local);
    }
  }
  return (xmlNodePtr)content_local;
}

Assistant:

xmlNodePtr
xmlNewComment(const xmlChar *content) {
    xmlNodePtr cur;

    /*
     * Allocate a new node and fill the fields.
     */
    cur = (xmlNodePtr) xmlMalloc(sizeof(xmlNode));
    if (cur == NULL) {
	xmlTreeErrMemory("building comment");
	return(NULL);
    }
    memset(cur, 0, sizeof(xmlNode));
    cur->type = XML_COMMENT_NODE;

    cur->name = xmlStringComment;
    if (content != NULL) {
	cur->content = xmlStrdup(content);
    }

    if ((__xmlRegisterCallbacks) && (xmlRegisterNodeDefaultValue))
	xmlRegisterNodeDefaultValue(cur);
    return(cur);
}